

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObservation.cpp
# Opt level: O1

void __thiscall CEObservation::init_members(CEObservation *this)

{
  CESkyCoord local_40;
  
  this->observer_ = (CEObserver *)0x0;
  this->cached_date_ = 0.0;
  this->body_ = (CEBody *)0x0;
  this->date_ = (CEDate *)0x0;
  CESkyCoord::CESkyCoord(&local_40);
  CESkyCoord::operator=(&this->cached_coords_,&local_40);
  CESkyCoord::~CESkyCoord(&local_40);
  this->cached_hour_angle_ = 0.0;
  this->cached_apparentxcoord_ = 0.0;
  this->cached_apparentycoord_ = 0.0;
  return;
}

Assistant:

void CEObservation::init_members(void)
{
    // Copy the pointers (this object does not own them)
    body_     = nullptr;
    date_     = nullptr;
    observer_ = nullptr;

    // Copy the cached values
    cached_date_           = 0.0;
    cached_coords_         = CESkyCoord();

    // Note that these are not filled at the moment
    cached_hour_angle_     = 0.0;
    cached_apparentxcoord_ = 0.0;
    cached_apparentycoord_ = 0.0;
}